

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.cpp
# Opt level: O2

void trt_pose::parse::assignment_out_k
               (int *connections,float *score_graph,int *topology,int *counts,int K,int M,
               float score_threshold,void *workspace)

{
  long lVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = 0;
  if (K < 1) {
    K = 0;
  }
  iVar3 = 0;
  for (lVar1 = 0; (ulong)(uint)K * 0x10 != lVar1; lVar1 = lVar1 + 0x10) {
    assignment_out(connections + iVar2,score_graph + iVar3,
                   counts[*(int *)((long)topology + lVar1 + 8)],
                   counts[*(int *)((long)topology + lVar1 + 0xc)],M,score_threshold,workspace);
    iVar3 = iVar3 + M * M;
    iVar2 = iVar2 + M * 2;
  }
  return;
}

Assistant:

void assignment_out_k(int *connections,         // Kx2xM
                      const float *score_graph, // KxMxM
                      const int *topology,      // Kx4
                      const int *counts,        // C
                      const int K, const int M, const float score_threshold,
                      void *workspace) {
  for (int k = 0; k < K; k++) {
    const int *tk = &topology[k * 4];
    const int cmap_idx_a = tk[2];
    const int cmap_idx_b = tk[3];
    const int count_a = counts[cmap_idx_a];
    const int count_b = counts[cmap_idx_b];
    assignment_out(&connections[k * 2 * M], &score_graph[k * M * M], count_a,
                   count_b, M, score_threshold, workspace);
  }
}